

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTextElement.cpp
# Opt level: O0

void __thiscall KDReports::TextElement::build(TextElement *this,ReportBuilder *builder)

{
  initializer_list<QString> args;
  bool bVar1;
  int pos;
  BrushStyle BVar2;
  QTextCursor *pQVar3;
  pointer pTVar4;
  TextDocumentData *this_00;
  pointer this_01;
  qsizetype qVar5;
  int weight;
  QString *local_c8;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  QString local_88;
  undefined1 local_70 [56];
  QTextCharFormat local_38 [8];
  QTextCharFormat charFormat;
  int charPosition;
  QTextCursor *cursor;
  ReportBuilder *builder_local;
  TextElement *this_local;
  
  pQVar3 = ReportBuilder::cursor(builder);
  pos = QTextCursor::position();
  QTextCursor::charFormat();
  cleanupVariableProperties(local_38);
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  if ((pTVar4->m_fontSet & 1U) != 0) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    QTextCharFormat::setFont((QFont *)local_38,(int)pTVar4 + 0x70);
  }
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  if ((pTVar4->m_boldIsSet & 1U) != 0) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    weight = 400;
    if ((pTVar4->m_bold & 1U) != 0) {
      weight = 700;
    }
    QTextCharFormat::setFontWeight(local_38,weight);
  }
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  if ((pTVar4->m_italicIsSet & 1U) != 0) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    QTextCharFormat::setFontItalic(local_38,(bool)(pTVar4->m_italic & 1));
  }
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  if ((pTVar4->m_underlineIsSet & 1U) != 0) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    QTextCharFormat::setFontUnderline(local_38,(bool)(pTVar4->m_underline & 1));
  }
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  if ((pTVar4->m_strikeoutIsSet & 1U) != 0) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    QTextCharFormat::setFontStrikeOut(local_38,(bool)(pTVar4->m_strikeout & 1));
  }
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  if (0.0 < pTVar4->m_pointSize) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    QTextCharFormat::setFontPointSize(local_38,pTVar4->m_pointSize);
  }
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  bVar1 = QString::isEmpty(&pTVar4->m_fontFamily);
  if (!bVar1) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    QString::QString(&local_88,&pTVar4->m_fontFamily);
    local_70._8_8_ = (char16_t *)0x1;
    args._M_len = 1;
    args._M_array = &local_88;
    local_70._0_8_ = &local_88;
    QList<QString>::QList((QList<QString> *)(local_70 + 0x10),args);
    QTextCharFormat::setFontFamilies(local_38,(QStringList *)(local_70 + 0x10));
    QList<QString>::~QList((QList<QString> *)(local_70 + 0x10));
    local_c8 = (QString *)local_70;
    do {
      local_c8 = local_c8 + -1;
      QString::~QString(local_c8);
    } while (local_c8 != &local_88);
  }
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  bVar1 = QColor::isValid(&pTVar4->m_foreground);
  if (bVar1) {
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush((QBrush *)(local_98 + 8),&pTVar4->m_foreground,SolidPattern);
    QTextFormat::setForeground((QTextFormat *)local_38,(QBrush *)(local_98 + 8));
    QBrush::~QBrush((QBrush *)(local_98 + 8));
  }
  else {
    QTextFormat::clearForeground((QTextFormat *)local_38);
  }
  Element::background((Element *)local_98);
  BVar2 = QBrush::style((QBrush *)local_98);
  QBrush::~QBrush((QBrush *)local_98);
  if (BVar2 == NoBrush) {
    QTextFormat::clearBackground((QTextFormat *)local_38);
  }
  else {
    Element::background((Element *)local_a0);
    QTextFormat::setBackground((QTextFormat *)local_38,(QBrush *)local_a0);
    QBrush::~QBrush((QBrush *)local_a0);
  }
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar3);
  std::
  unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>::
  operator->(&this->d);
  QTextCursor::insertText((QString *)pQVar3);
  pTVar4 = std::
           unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ::operator->(&this->d);
  bVar1 = QString::isEmpty(&pTVar4->m_id);
  if (!bVar1) {
    this_00 = ReportBuilder::currentDocumentData(builder);
    pTVar4 = std::
             unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ::operator->(&this->d);
    this_01 = std::
              unique_ptr<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
              ::operator->(&this->d);
    qVar5 = QString::length(&this_01->m_string);
    TextDocumentData::setTextValueMarker(this_00,pos,&pTVar4->m_id,(int)qVar5,false);
  }
  QTextCharFormat::~QTextCharFormat(local_38);
  return;
}

Assistant:

void KDReports::TextElement::build(ReportBuilder &builder) const
{
    QTextCursor &cursor = builder.cursor();
    const int charPosition = cursor.position();
    QTextCharFormat charFormat = cursor.charFormat();
    KDReports::cleanupVariableProperties(charFormat);
    if (d->m_fontSet) {
#if QT_VERSION >= QT_VERSION_CHECK(5, 3, 0)
        charFormat.setFont(d->m_font, QTextCharFormat::FontPropertiesSpecifiedOnly);
#else
        charFormat.setFont(d->m_font);
#endif
    }
    if (d->m_boldIsSet)
        charFormat.setFontWeight(d->m_bold ? QFont::Bold : QFont::Normal);
    if (d->m_italicIsSet)
        charFormat.setFontItalic(d->m_italic);
    if (d->m_underlineIsSet)
        charFormat.setFontUnderline(d->m_underline);
    if (d->m_strikeoutIsSet)
        charFormat.setFontStrikeOut(d->m_strikeout);
    if (d->m_pointSize > 0)
        charFormat.setFontPointSize(d->m_pointSize);
    if (!d->m_fontFamily.isEmpty())
#if QT_VERSION >= QT_VERSION_CHECK(6, 1, 0)
        charFormat.setFontFamilies({d->m_fontFamily});
#else
        charFormat.setFontFamily(d->m_fontFamily);
#endif
    if (d->m_foreground.isValid())
        charFormat.setForeground(d->m_foreground);
    else
        charFormat.clearForeground();
    if (background().style() != Qt::NoBrush)
        charFormat.setBackground(background());
    else
        charFormat.clearBackground();
    cursor.setCharFormat(charFormat);
    cursor.insertText(d->m_string);
    if (!d->m_id.isEmpty())
        builder.currentDocumentData().setTextValueMarker(charPosition, d->m_id, d->m_string.length(), false);
}